

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcexecutors.cpp
# Opt level: O0

int __thiscall
trun::TestFuncExecutorSequential::Execute
          (TestFuncExecutorSequential *this,TestFunc *testFunc,CBPrePostHook *cbPreHook,
          CBPrePostHook *cbPostHook)

{
  bool bVar1;
  ILogger *pIVar2;
  element_type *this_00;
  TestResponseProxy *proxy_00;
  int postHookReturnCode;
  value_type *frame;
  string exceptionString;
  path pathname;
  stacktrace_frame *frame_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *__range2;
  int idxTargetFrame;
  stacktrace *exception_stacktrace;
  unwind_interceptor *anon_var_0;
  int local_98;
  int iStack_94;
  try_canary cpptrace_try_canary;
  int testReturnCode;
  int preHookReturnCode;
  TestResponseProxy *proxy;
  undefined1 local_80 [8];
  Ref currentModule;
  allocator<char> local_59;
  string local_58;
  ILogger *local_38;
  ILogger *pLogger;
  CBPrePostHook *cbPostHook_local;
  CBPrePostHook *cbPreHook_local;
  TestFunc *testFunc_local;
  TestFuncExecutorSequential *this_local;
  
  pLogger = (ILogger *)cbPostHook;
  cbPostHook_local = cbPreHook;
  cbPreHook_local = (CBPrePostHook *)testFunc;
  testFunc_local = (TestFunc *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"TestFuncExeSeq",&local_59)
  ;
  pIVar2 = gnilk::Logger::GetLogger(&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_38 = pIVar2;
  TestRunner::GetCurrentTestModule();
  bVar1 = std::operator==((shared_ptr<trun::TestModule> *)local_80,(nullptr_t)0x0);
  if (bVar1) {
    gnilk::Log::Error<char_const*>(local_38,"No module, can\'t execute!");
    this_local._4_4_ = -1;
  }
  else {
    this_00 = std::__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_80);
    proxy_00 = TestModule::GetTestResponseProxy(this_00);
    if (cbPostHook_local->cbHookV1 != (TRUN_PRE_POST_HOOK_DELEGATE_V1 *)0x0) {
      TestFunc::ChangeExecState((TestFunc *)cbPreHook_local,PreCallback);
      iStack_94 = TestFuncExecutorBase::InvokeHook
                            (&this->super_TestFuncExecutorBase,cbPostHook_local);
      this_local._4_4_ = iStack_94;
      if (iStack_94 != 0) goto LAB_0013f6f2;
    }
    local_98 = 0;
    TestFunc::ChangeExecState((TestFunc *)cbPreHook_local,Main);
    local_98 = TestFunc::InvokeTestCase((TestFunc *)cbPreHook_local,proxy_00);
    cpptrace::detail::try_canary::~try_canary((try_canary *)((long)&anon_var_0 + 7));
    if (pLogger->_vptr_Log != (_func_int **)0x0) {
      TestFunc::ChangeExecState((TestFunc *)cbPreHook_local,PostCallback);
      this_local._4_4_ =
           TestFuncExecutorBase::InvokeHook
                     (&this->super_TestFuncExecutorBase,(CBPrePostHook *)pLogger);
      if (this_local._4_4_ != 0) goto LAB_0013f6f2;
    }
    if (local_98 != 0) {
      TestFunc::ChangeExecState((TestFunc *)cbPreHook_local,Main);
    }
    this_local._4_4_ = local_98;
  }
LAB_0013f6f2:
  std::shared_ptr<trun::TestModule>::~shared_ptr((shared_ptr<trun::TestModule> *)local_80);
  return this_local._4_4_;
}

Assistant:

int TestFuncExecutorSequential::Execute(TestFunc *testFunc, const CBPrePostHook &cbPreHook, const CBPrePostHook &cbPostHook) {
    // Begin test, note: THIS MUST BE DONE HERE - in case of threading!
    gnilk::ILogger  *pLogger = gnilk::Logger::GetLogger("TestFuncExeSeq");
    auto currentModule = TestRunner::GetCurrentTestModule();
    if (currentModule == nullptr) {
        pLogger->Error("No module, can't execute!");
        return -1;
    }

    auto &proxy = currentModule->GetTestResponseProxy();

    // Test-case pre function, note: cbPreHook is a union of funcptrs - doesn't matter which one I check against!
    if (cbPreHook.cbHookV1 != nullptr) {
        // Note: in case of threaded test execution, we this will terminate on error - we need to disable thread here OR we need to actually thread pre/post as well
        testFunc->ChangeExecState(TestFunc::kExecState::PreCallback);

        int preHookReturnCode = InvokeHook(cbPreHook);
        //preHookReturnCode = cbPreHook();
        if (preHookReturnCode != kTR_Pass) {
            //testReturnCode = preHookReturnCode;
            return preHookReturnCode;
        }
    }

    // Main (the actual test case)
    int testReturnCode = {};
    testFunc->ChangeExecState(TestFunc::kExecState::Main);

    // Trying 'cpptrace' to get a nice stack frame from an exception...
    // CPPTrace requires 'special' try/catch - there is some magic here
#ifdef TRUN_HAVE_EXCEPTIONS
    CPPTRACE_TRY {
        testReturnCode = testFunc->InvokeTestCase(proxy);
    } CPPTRACE_CATCH(...) {
        auto &exception_stacktrace = cpptrace::from_current_exception();

        // Ok, trying to print up to the test-runner code...
        // stop when the stack frame leaves the code under test
        int idxTargetFrame = 0;
        for(const auto& frame : exception_stacktrace.frames) {
            auto pathname = std::filesystem::path(frame.filename);
            if (pathname.filename() == "testfunc.h") {
                idxTargetFrame -= 1;
                break;
            }
            // FIXME: store this in conjunction with the result??
            cpptrace::print_frame(std::cout, true, 2, idxTargetFrame, frame);
            std::cout << "\n";
            idxTargetFrame++;
        }

        // Consider declaring an 'ExceptionError' in the Result class
        auto exceptionString = HandleException();
        auto &frame = exception_stacktrace.frames.at(idxTargetFrame);
        if (frame.line.has_value()) {
            printf("*** EXCEPTION ERROR: %s\t'%s'\n", frame.filename.c_str(), exceptionString.c_str());
        } else {
            printf("*** EXCEPTION ERROR: %s:%d\t'%s'\n",
                   frame.filename.c_str(), frame.line.value(),
                   exceptionString.c_str());
        }


        // Normally this would be printed in the Response Proxy
        // But exceptions are caught by the runner - thus, we print it here...
        proxy.SetExceptionError(exceptionString);
        testReturnCode = kTR_Fail;
    }
#else
    testReturnCode = testFunc->InvokeTestCase(proxy);
#endif
    // Test-case post function, note cbPostHook is a union of funcptrs - doesn't matter which one we check
    if (cbPostHook.cbHookV1 != nullptr) {
        testFunc->ChangeExecState(TestFunc::kExecState::PostCallback);
        int postHookReturnCode = InvokeHook(cbPostHook);
        //int postHookReturnCode = cbPostHook((ITestingV2 *)TestResponseProxy::GetTRTestInterface());
        if (postHookReturnCode != kTR_Pass) {
            return postHookReturnCode;
        }
    }

    // IF the thread is terminated - this won't matter - we will be in the correct state
    // However, IF post-hook is successful - but main function failed - we have changed the state and should change it back..
    if (testReturnCode != kTR_Pass) {
        testFunc->ChangeExecState(TestFunc::kExecState::Main);
    }

    return testReturnCode;
}